

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_code(Parser *psr)

{
  BcIns ins;
  Package *pPVar1;
  Function *fn;
  int local_28;
  BcIns ret;
  FnScope top_level;
  Parser *psr_local;
  
  top_level.outer_scope = (fn_scope *)psr;
  lex_next(&psr->lxr);
  pPVar1 = psr_pkg((Parser *)top_level.outer_scope);
  local_28 = pPVar1->main_fn;
  ret = 0;
  top_level.fn = 0;
  top_level.next_slot = 0;
  top_level._12_4_ = 0;
  *(int **)(top_level.outer_scope + 3) = &local_28;
  parse_block((Parser *)top_level.outer_scope);
  ins = bc_new3(BC_RET,'\0','\0','\0');
  fn = psr_fn((Parser *)top_level.outer_scope);
  fn_emit(fn,ins);
  top_level.outer_scope[3].fn = 0;
  top_level.outer_scope[3].first_local = 0;
  return;
}

Assistant:

static void parse_code(Parser *psr) {
	// parse the first lexer token. we leave this until now since it might
	// generate an error, which needs to be caught by the error guard that is
	// only set up just before this function is called
	lex_next(&psr->lxr);

	// Create a function scope for the top level code in the package
	FnScope top_level;
	top_level.fn = psr_pkg(psr)->main_fn;
	top_level.first_local = 0;
	top_level.next_slot = 0;
	top_level.outer_scope = NULL;
	psr->scope = &top_level;

	// Parse the package's top level source code
	parse_block(psr);

	// Add a RET instruction at the end of the package
	BcIns ret = bc_new3(BC_RET, 0, 0, 0);
	fn_emit(psr_fn(psr), ret);

	// Don't let the stack-allocated function scope escape, leaving a dangling
	// pointer
	psr->scope = NULL;
}